

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

bool isValidNumber(string *n)

{
  bool bVar1;
  regex regex;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&regex,"\\d+",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (n,&regex,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regex);
  return bVar1;
}

Assistant:

bool isValidNumber(const std::string& n)
{
	std::regex regex("\\d+");
	return std::regex_match(n, regex);
}